

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

Node * prvTidyFindHTML(TidyDocImpl *doc)

{
  Node *pNVar1;
  
  if (doc != (TidyDocImpl *)0x0) {
    for (pNVar1 = (doc->root).content; pNVar1 != (Node *)0x0; pNVar1 = pNVar1->next) {
      if ((pNVar1->tag != (Dict *)0x0) && (pNVar1->tag->id == TidyTag_HTML)) {
        return pNVar1;
      }
    }
  }
  return (Node *)0x0;
}

Assistant:

Node *TY_(FindHTML)( TidyDocImpl* doc )
{
    Node *node;
    for ( node = (doc ? doc->root.content : NULL);
          node && !nodeIsHTML(node); 
          node = node->next )
        /**/;

    return node;
}